

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLut.c
# Opt level: O0

void Abc_NodeSuperChoiceCollect_rec(Abc_Obj_t *pObj,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vVolume)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Vec_Ptr_t *vVolume_local;
  Vec_Ptr_t *vLeaves_local;
  Abc_Obj_t *pObj_local;
  
  if ((*(uint *)&pObj->field_0x14 >> 5 & 1) != 0) {
    Vec_PtrPush(vLeaves,pObj);
    *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 & 0xffffffdf;
  }
  if ((*(uint *)&pObj->field_0x14 >> 6 & 1) == 0) {
    *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 & 0xffffffbf | 0x40;
    iVar1 = Abc_ObjFaninNum(pObj);
    if (iVar1 != 2) {
      __assert_fail("Abc_ObjFaninNum(pObj) == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcLut.c"
                    ,0x1c0,
                    "void Abc_NodeSuperChoiceCollect_rec(Abc_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
    }
    pAVar2 = Abc_ObjFanin0(pObj);
    Abc_NodeSuperChoiceCollect_rec(pAVar2,vLeaves,vVolume);
    pAVar2 = Abc_ObjFanin1(pObj);
    Abc_NodeSuperChoiceCollect_rec(pAVar2,vLeaves,vVolume);
    Vec_PtrPush(vVolume,pObj);
  }
  return;
}

Assistant:

void Abc_NodeSuperChoiceCollect_rec( Abc_Obj_t * pObj, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vVolume )
{
    if ( pObj->fMarkB )
    {
        Vec_PtrPush( vLeaves, pObj );
        pObj->fMarkB = 0;
    }
    if ( pObj->fMarkC )
        return;
    pObj->fMarkC = 1;
    assert( Abc_ObjFaninNum(pObj) == 2 );
    Abc_NodeSuperChoiceCollect_rec( Abc_ObjFanin0(pObj), vLeaves, vVolume );
    Abc_NodeSuperChoiceCollect_rec( Abc_ObjFanin1(pObj), vLeaves, vVolume );
    Vec_PtrPush( vVolume, pObj );
}